

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

void al_remove_path_component(ALLEGRO_PATH *path,int i)

{
  ALLEGRO_USTR *us;
  
  if (i < 0) {
    i = i + (int)(path->segments)._size;
  }
  us = get_segment(path,i);
  al_ustr_free(us);
  _al_vector_delete_at(&path->segments,i);
  return;
}

Assistant:

void al_remove_path_component(ALLEGRO_PATH *path, int i)
{
   ASSERT(path);
   ASSERT(i < (int)_al_vector_size(&path->segments));

   if (i < 0)
      i = _al_vector_size(&path->segments) + i;

   ASSERT(i >= 0);

   al_ustr_free(get_segment(path, i));
   _al_vector_delete_at(&path->segments, i);
}